

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

int fetch_label(char *dest,char *src,char *base,char **next)

{
  short sVar1;
  long lVar2;
  byte bVar3;
  ushort uVar4;
  ushort *puVar5;
  short sVar6;
  long lVar7;
  int iVar8;
  
  bVar3 = *src;
  puVar5 = (ushort *)src;
  if (bVar3 == 0) {
    iVar8 = -1;
LAB_00101967:
    dest[iVar8] = '\0';
    if (next != (char **)0x0) {
      *next = src;
    }
  }
  else {
    do {
      lVar2 = 0;
      iVar8 = 0;
      sVar6 = 0;
      src = (char *)puVar5;
      while (sVar1 = (short)iVar8, bVar3 < 0x40) {
        lVar7 = 0;
        do {
          dest[(short)(sVar1 + (short)lVar7)] = *(char *)((long)puVar5 + lVar7 + lVar2 + 1);
          lVar7 = lVar7 + 1;
        } while (lVar7 < (char)*(ushort *)src);
        iVar8 = iVar8 + (int)lVar7 + 1;
        dest[(short)(sVar1 + (short)lVar7)] = '.';
        sVar6 = sVar6 + 1 + (short)(char)*(ushort *)src;
        lVar2 = (long)sVar6;
        src = (char *)((long)puVar5 + lVar2);
        bVar3 = *(byte *)((long)puVar5 + lVar2);
        if (bVar3 == 0) {
          iVar8 = (short)(sVar1 + (short)lVar7 + 1) + -1;
          goto LAB_00101967;
        }
      }
      uVar4 = *(ushort *)src;
      if (next != (char **)0x0) {
        *next = (char *)((long)src + 2);
      }
      uVar4 = (uVar4 & 0xff3f) << 8 | uVar4 >> 8;
      dest = dest + sVar1;
      puVar5 = (ushort *)(base + uVar4);
      bVar3 = base[uVar4];
      next = (char **)0x0;
    } while (bVar3 != 0);
    dest[-1] = '\0';
    iVar8 = -1;
  }
  return iVar8;
}

Assistant:

int fetch_label(char *dest, char *src, char *base, char **next) {
  /*
  获取标签。

  dest: 要复制到的字符串
  src:  压缩字符串开始的位置
  base: DNS报文头
  next:串结束的位置，不需要的话可以传入一个NULL
  返回值：
  -1： 异常
  其他正数： 读取的字符串长度

  压缩方案使得标签有如下三种可能：
  * 以'\0'结束
  * 以指针结束
  * 指针（只有一个指针）
  并且，一个标签最多只有一个指针。

  下面的解决方案是：
  * 如果头是指针，直接整个复制下来。
  * 否则，按正常的读取，直到遇到指针或者0.
  * 遇到0，则终止；否则整个复制下来，结束。
  */
  short now = 0;
  short i = 0;
  
  while (src[now] != 0) {
    // printf("%d ",now);fflush(stdout);
    if (is_compress(src[now])) {
      unsigned short pos =
          get_compress_pos(ntohs(*(const unsigned short *)(src + now)));
      // printf("pos=%d ",pos);fflush(stdout);
      if (next)
        *next = src + now + 2;
      return fetch_label(dest + i, base + pos, base, NULL);
    } else {
      // printf(" bbb ");fflush(stdout);
      for (short j = 1; j <= src[now]; j++){
        dest[i++] = src[j + now];
      }
      dest[i++] = '.';
      now += src[now] + 1;
    }
  }
  dest[i - 1] = '\0';
  if (next)
    *next = src + now;
  // printf("\n");fflush(stdout);
  return i - 1;
}